

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateReturnStatement
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *commandName,
          CommandData *commandData,string *returnVariable,string *returnType,
          string *decoratedReturnType,string *dataType,size_t initialSkipCount,size_t returnParam,
          CommandFlavourFlags flavourFlags,bool enumerating,bool raii)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  VulkanHppGenerator *pVVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  size_type __len2;
  string strippedValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  paVar6 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar6;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_100._M_string_length = (size_type)(commandData->returnType)._M_dataplus._M_p;
  local_100._M_dataplus._M_p = (pointer)(commandData->returnType)._M_string_length;
  local_78 = commandName;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,"Vk");
  if (!bVar2) {
    if ((flavourFlags.m_mask & 8) != 0) {
      __assert_fail("!unique",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x29be,
                    "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                   );
    }
    if (returnVariable->_M_string_length != 0) {
      std::operator+(&local_120,"return ",returnVariable);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_120,";");
      generateReturnStatement();
      return __return_storage_ptr__;
    }
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&commandData->returnType,"void");
    if (iVar3 == 0) {
      return __return_storage_ptr__;
    }
    __len2 = 0xe;
    pcVar7 = "return result;";
LAB_001612ca:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,pcVar7,__len2);
    return __return_storage_ptr__;
  }
  pbVar4 = (commandData->successCodes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(commandData->successCodes).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
  local_c0 = paVar6;
  if (lVar5 == 0x20 || enumerating && lVar5 == 0x40) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (pbVar4,"VK_SUCCESS");
    if (iVar3 != 0) {
      __assert_fail("commandData.successCodes[0] == \"VK_SUCCESS\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2979,
                    "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                   );
    }
    if ((raii) ||
       ((commandData->errorCodes).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (commandData->errorCodes).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if (returnVariable->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      std::operator+(&local_120,"return ",returnVariable);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_120,";");
      generateReturnStatement();
      return __return_storage_ptr__;
    }
    if (returnVariable->_M_string_length == 0) {
      if ((flavourFlags.m_mask & 8) != 0) {
        __assert_fail("!unique",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2985,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      __len2 = 0x45;
      pcVar7 = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result );";
      goto LAB_001612ca;
    }
    if ((flavourFlags.m_mask & 8) == 0) {
      std::operator+(&local_120,
                     "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, std::move( "
                     ,returnVariable);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_120," ) );");
      generateReturnStatement();
      return __return_storage_ptr__;
    }
    if (returnParam == 0xffffffffffffffff) {
      __assert_fail("returnParam != INVALID_INDEX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x298a,
                    "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,
               "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, ");
    local_100._M_string_length = (size_type)(dataType->_M_dataplus)._M_p;
    local_100._M_dataplus._M_p = (pointer)dataType->_M_string_length;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,"std::");
    if (bVar2) {
      anon_unknown.dwarf_1900a8::startUpperCase(&local_e0,returnVariable);
      std::operator+(&local_120,"std::move( unique",&local_e0);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_120," )");
      local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == paVar6) {
        local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_100._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_100._M_dataplus._M_p,local_100._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
LAB_0016153f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      local_70.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = local_e0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
LAB_001616da:
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_100._M_string_length = (size_type)(dataType->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = (pointer)dataType->_M_string_length;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,
                         "VULKAN_HPP_NAMESPACE::");
      if (!bVar2) {
        __assert_fail("dataType.starts_with( \"VULKAN_HPP_NAMESPACE::\" )",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2992,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      std::operator+(&local_98,returnType,"( ");
      std::operator+(&local_b8,&local_98,returnVariable);
      pVVar11 = (VulkanHppGenerator *)0x224766;
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b8,", ");
      local_e0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == paVar6) {
        local_e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_e0._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      generateObjectDeleter(&local_70,pVVar11,local_78,commandData,initialSkipCount,returnParam);
      std::operator+(&local_120,&local_e0,&local_70);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_120," )");
      local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == paVar6) {
        local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_100._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_100._M_dataplus._M_p,local_100._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_70.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_001616da;
    }
LAB_001616e2:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," );");
  }
  else {
    if (returnVariable->_M_string_length == 0) {
      if ((flavourFlags.m_mask & 8) != 0) {
        __assert_fail("!unique",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x29a2,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Vk","");
      pcVar1 = (commandData->returnType)._M_dataplus._M_p;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar1,pcVar1 + (commandData->returnType)._M_string_length);
      if ((local_b8._M_string_length <= local_e0._M_string_length) &&
         ((local_b8._M_string_length == 0 ||
          (iVar3 = bcmp(local_e0._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                        local_b8._M_string_length), iVar3 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_e0,0,local_b8._M_string_length);
      }
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_e0,0,0,"return static_cast<VULKAN_HPP_NAMESPACE::",0x29);
      local_120._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p == paVar6) {
        local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      }
      else {
        local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_120._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_120,">( result );");
      local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == paVar6) {
        local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_100._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      local_98.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
      _Var13._M_p = local_b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return __return_storage_ptr__;
      }
    }
    else {
      if ((flavourFlags.m_mask & 8) != 0) {
        if (returnParam == 0xffffffffffffffff) {
          __assert_fail("returnParam != INVALID_INDEX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x29a7,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        local_100._M_string_length = (size_type)(decoratedReturnType->_M_dataplus)._M_p;
        local_100._M_dataplus._M_p = (pointer)decoratedReturnType->_M_string_length;
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,
                           "ResultValue<");
        if (!bVar2) {
LAB_001620df:
          __assert_fail("decoratedReturnType.starts_with( \"ResultValue<\" ) && decoratedReturnType.ends_with( \">\" )"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x29a8,
                        "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                       );
        }
        local_100._M_string_length = (size_type)(decoratedReturnType->_M_dataplus)._M_p;
        local_100._M_dataplus._M_p = (pointer)decoratedReturnType->_M_string_length;
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,">");
        if (!bVar2) goto LAB_001620df;
        std::operator+(&local_120,"return ",decoratedReturnType);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_120,"( result, ");
        paVar6 = &local_100.field_2;
        local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar8 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar8) {
          local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_100._M_dataplus._M_p = (pointer)paVar6;
        }
        else {
          local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_100._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar6) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        local_100._M_string_length = (size_type)(dataType->_M_dataplus)._M_p;
        local_100._M_dataplus._M_p = (pointer)dataType->_M_string_length;
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,"std::");
        if (bVar2) {
          anon_unknown.dwarf_1900a8::startUpperCase(&local_e0,returnVariable);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_e0,0,0,"std::move( unique",0x11);
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar9 = &pbVar4->field_2;
          if (paVar8 == paVar9) {
            local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_120._M_dataplus._M_p = (pointer)paVar8;
          }
          local_120._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_120," )");
          local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar8 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p == paVar8) {
            local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_100._M_dataplus._M_p = (pointer)paVar6;
          }
          else {
            local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          }
          local_100._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_100._M_dataplus._M_p,local_100._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != paVar6) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0016153f;
        }
        std::operator+(&local_70,"UniqueHandle<",dataType);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_70,", Dispatch>( ");
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar9 = &pbVar4->field_2;
        if (paVar8 == paVar9) {
          local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_98._M_dataplus._M_p = (pointer)paVar8;
        }
        local_98._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_98,(returnVariable->_M_dataplus)._M_p,
                           returnVariable->_M_string_length);
        local_b8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar8 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar8) {
          local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pVVar11 = (VulkanHppGenerator *)0x224766;
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_b8,", ");
        paVar8 = &local_e0.field_2;
        local_e0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar9 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p == paVar9) {
          local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_e0._M_dataplus._M_p = (pointer)paVar8;
        }
        else {
          local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_e0._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        generateObjectDeleter(&local_50,pVVar11,local_78,commandData,initialSkipCount,returnParam);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar8) {
          uVar12 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_50._M_string_length + local_e0._M_string_length) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            uVar12 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_50._M_string_length + local_e0._M_string_length)
          goto LAB_00161e97;
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_50,0,0,local_e0._M_dataplus._M_p,local_e0._M_string_length);
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar4->_M_dataplus)._M_p;
          paVar9 = &pbVar4->field_2;
          if (paVar10 != paVar9) goto LAB_00161ef2;
          local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
LAB_00161e97:
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_e0,local_50._M_dataplus._M_p,local_50._M_string_length);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar4->_M_dataplus)._M_p;
          paVar9 = &pbVar4->field_2;
          if (paVar10 == paVar9) {
            local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          }
          else {
LAB_00161ef2:
            local_120.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_120._M_dataplus._M_p = (pointer)paVar10;
          }
        }
        local_120._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar4->_M_string_length = 0;
        paVar9->_M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_120," )");
        local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar9 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar9) {
          local_100.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_100._M_dataplus._M_p = (pointer)paVar6;
        }
        else {
          local_100.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_100._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_100._M_dataplus._M_p,local_100._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar6) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar8) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_001616da;
        goto LAB_001616e2;
      }
      pcVar7 = "ResultValue<";
      if (raii) {
        pcVar7 = "std::pair<VULKAN_HPP_NAMESPACE::Result, ";
      }
      local_100._M_string_length = (size_type)(decoratedReturnType->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = (pointer)decoratedReturnType->_M_string_length;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,pcVar7);
      if (!bVar2) {
LAB_001620c0:
        __assert_fail("decoratedReturnType.starts_with( raii ? \"std::pair<VULKAN_HPP_NAMESPACE::Result, \" : \"ResultValue<\" ) && decoratedReturnType.ends_with( \">\" )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x29b7,
                      "std::string VulkanHppGenerator::generateReturnStatement(const std::string &, const CommandData &, const std::string &, const std::string &, const std::string &, const std::string &, size_t, size_t, CommandFlavourFlags, bool, bool) const"
                     );
      }
      local_100._M_string_length = (size_type)(decoratedReturnType->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = (pointer)decoratedReturnType->_M_string_length;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_100,">");
      if (!bVar2) goto LAB_001620c0;
      paVar6 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar6;
      if (raii) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"std::make_pair","");
      }
      else {
        pcVar1 = (decoratedReturnType->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar1,pcVar1 + decoratedReturnType->_M_string_length);
      }
      std::operator+(&local_b8,"return ",&local_98);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b8,"( result, std::move( ");
      local_e0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar8 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == paVar8) {
        local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_e0._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_e0,(returnVariable->_M_dataplus)._M_p,
                         returnVariable->_M_string_length);
      local_120._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar8 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p == paVar8) {
        local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      }
      else {
        local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_120._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_120," ) );");
      local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar8 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == paVar8) {
        local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_100._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      _Var13._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == paVar6) {
        return __return_storage_ptr__;
      }
    }
    operator_delete(_Var13._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateReturnStatement( std::string const & commandName,
                                                         CommandData const & commandData,
                                                         std::string const & returnVariable,
                                                         std::string const & returnType,
                                                         std::string const & decoratedReturnType,
                                                         std::string const & dataType,
                                                         size_t              initialSkipCount,
                                                         size_t              returnParam,
                                                         CommandFlavourFlags flavourFlags,
                                                         bool                enumerating,
                                                         bool                raii ) const
{
  const bool unique = flavourFlags & CommandFlavourFlagBits::unique;

  std::string returnStatement;
  if ( commandData.returnType.starts_with( "Vk" ) )
  {
    if ( ( commandData.successCodes.size() == 1 ) || ( enumerating && ( commandData.successCodes.size() == 2 ) ) )
    {
      assert( commandData.successCodes[0] == "VK_SUCCESS" );
      if ( raii || commandData.errorCodes.empty() )
      {
        if ( !returnVariable.empty() )
        {
          returnStatement = "return " + returnVariable + ";";
        }
      }
      else
      {
        if ( returnVariable.empty() )
        {
          assert( !unique );
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result );";
        }
        else if ( unique )
        {
          assert( returnParam != INVALID_INDEX );
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, ";
          if ( dataType.starts_with( "std::" ) )
          {
            returnStatement += "std::move( unique" + startUpperCase( returnVariable ) + " )";
          }
          else
          {
            assert( dataType.starts_with( "VULKAN_HPP_NAMESPACE::" ) );
            returnStatement +=
              returnType + "( " + returnVariable + ", " + generateObjectDeleter( commandName, commandData, initialSkipCount, returnParam ) + " )";
          }
          returnStatement += " );";
        }
        else
        {
          returnStatement = "return VULKAN_HPP_NAMESPACE::detail::createResultValueType( result, std::move( " + returnVariable + " ) );";
        }
      }
    }
    else
    {
      if ( returnVariable.empty() )
      {
        assert( !unique );
        returnStatement = "return static_cast<VULKAN_HPP_NAMESPACE::" + stripPrefix( commandData.returnType, "Vk" ) + ">( result );";
      }
      else if ( unique )
      {
        assert( returnParam != INVALID_INDEX );
        assert( decoratedReturnType.starts_with( "ResultValue<" ) && decoratedReturnType.ends_with( ">" ) );
        returnStatement = "return " + decoratedReturnType + "( result, ";
        if ( dataType.starts_with( "std::" ) )
        {
          returnStatement += "std::move( unique" + startUpperCase( returnVariable ) + " )";
        }
        else
        {
          returnStatement += "UniqueHandle<" + dataType + ", Dispatch>( " + returnVariable + ", " +
                             generateObjectDeleter( commandName, commandData, initialSkipCount, returnParam ) + " )";
        }
        returnStatement += " );";
      }
      else
      {
        assert( decoratedReturnType.starts_with( raii ? "std::pair<VULKAN_HPP_NAMESPACE::Result, " : "ResultValue<" ) && decoratedReturnType.ends_with( ">" ) );
        returnStatement = "return " + ( raii ? "std::make_pair" : decoratedReturnType ) + "( result, std::move( " + returnVariable + " ) );";
      }
    }
  }
  else
  {
    assert( !unique );
    if ( returnVariable.empty() )
    {
      if ( commandData.returnType != "void" )
      {
        returnStatement = "return result;";
      }
    }
    else
    {
      returnStatement = "return " + returnVariable + ";";
    }
  }
  return returnStatement;
}